

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O2

void __thiscall YsSoundPlayer::APISpecificData::DiscardEnded(APISpecificData *this)

{
  pointer pPVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  
  lVar3 = ((long)(this->playing).
                 super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->playing).
                super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  lVar5 = lVar3 * 0x18;
  for (; 0 < lVar3; lVar3 = lVar3 + -1) {
    pPVar1 = (this->playing).
             super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(long *)((long)&pPVar1[-1].dat + lVar5) == 0) {
      puVar4 = (undefined8 *)((long)&pPVar1[-1].dat + lVar5);
      pPVar1 = (this->playing).
               super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar4[2] = *(undefined8 *)&pPVar1[-1].stop;
      uVar2 = *(undefined8 *)&pPVar1[-1].ptr;
      *puVar4 = pPVar1[-1].dat;
      puVar4[1] = uVar2;
      std::
      vector<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
      ::resize(&this->playing,
               ((long)(this->playing).
                      super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->playing).
                     super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18 - 1);
    }
    lVar5 = lVar5 + -0x18;
  }
  if ((this->playing).
      super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->playing).
      super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    return;
  }
  snd_pcm_drop(this->handle);
  return;
}

Assistant:

void YsSoundPlayer::APISpecificData::DiscardEnded(void)
{
	for(long long int i=playing.size()-1; 0<=i; --i)
	{
		if(nullptr==playing[i].dat)
		{
			playing[i]=playing.back();
			playing.resize(playing.size()-1);
		}
	}

	if(0==playing.size())
	{
		snd_pcm_drop(handle);
	}
}